

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int emit_string(nghttp2_bufs *bufs,uint8_t *str,size_t len)

{
  size_t sVar1;
  bool bVar2;
  size_t sStack_60;
  int huffman;
  size_t enclen;
  size_t blocklen;
  uint8_t *bufp;
  uint8_t sb [16];
  int local_2c;
  int rv;
  size_t len_local;
  uint8_t *str_local;
  nghttp2_bufs *bufs_local;
  
  sVar1 = nghttp2_hd_huff_encode_count(str,len);
  bVar2 = sVar1 < len;
  sStack_60 = len;
  if (bVar2) {
    sStack_60 = sVar1;
  }
  sVar1 = count_encoded_length(sStack_60,7);
  if (sVar1 < 0x11) {
    bufp._0_1_ = 0;
    if (bVar2) {
      bufp._0_1_ = 0x80;
    }
    encode_length((uint8_t *)&bufp,sStack_60,7);
    bufs_local._4_4_ = nghttp2_bufs_add(bufs,&bufp,sVar1);
    if (bufs_local._4_4_ == 0) {
      if (bVar2) {
        local_2c = nghttp2_hd_huff_encode(bufs,str,len);
      }
      else {
        if (sStack_60 != len) {
          __assert_fail("enclen == len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_hd.c"
                        ,0x3f1,"int emit_string(nghttp2_bufs *, const uint8_t *, size_t)");
        }
        local_2c = nghttp2_bufs_add(bufs,str,len);
      }
      bufs_local._4_4_ = local_2c;
    }
  }
  else {
    bufs_local._4_4_ = -0x20b;
  }
  return bufs_local._4_4_;
}

Assistant:

static int emit_string(nghttp2_bufs *bufs, const uint8_t *str, size_t len) {
  int rv;
  uint8_t sb[16];
  uint8_t *bufp;
  size_t blocklen;
  size_t enclen;
  int huffman = 0;

  enclen = nghttp2_hd_huff_encode_count(str, len);

  if (enclen < len) {
    huffman = 1;
  } else {
    enclen = len;
  }

  blocklen = count_encoded_length(enclen, 7);

  DEBUGF("deflatehd: emit string str=%.*s, length=%zu, huffman=%d, "
         "encoded_length=%zu\n",
         (int)len, (const char *)str, len, huffman, enclen);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;
  *bufp = huffman ? 1 << 7 : 0;
  encode_length(bufp, enclen, 7);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  if (huffman) {
    rv = nghttp2_hd_huff_encode(bufs, str, len);
  } else {
    assert(enclen == len);
    rv = nghttp2_bufs_add(bufs, str, len);
  }

  return rv;
}